

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateGraphicsPipelineDesc
               (PipelineStateDesc *PSODesc,GraphicsPipelineDesc *GraphicsPipeline,
               ShadingRateProperties *SRProps)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  PIPELINE_SHADING_RATE_FLAGS PVar7;
  SHADING_RATE_CAP_FLAGS SVar8;
  char *local_e0;
  char *local_d8;
  InputLayoutDesc *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  long local_a8;
  LayoutElement *Elem;
  char *pcStack_98;
  Uint32 i;
  char *local_90;
  SHADING_RATE_TEXTURE_ACCESS *local_88;
  InputLayoutDesc *InputLayout;
  char *local_78;
  char *local_70;
  char *local_68;
  uint local_5c;
  char *pcStack_58;
  Uint32 RequiredMask;
  char *local_50;
  ShadingRateProperties *local_48;
  ShadingRateProperties *SRProps_local;
  GraphicsPipelineDesc *GraphicsPipeline_local;
  PipelineStateDesc *PSODesc_local;
  
  local_48 = SRProps;
  SRProps_local = (ShadingRateProperties *)GraphicsPipeline;
  GraphicsPipeline_local = (GraphicsPipelineDesc *)PSODesc;
  if (GraphicsPipeline->NumViewports == '\0') {
    local_50 = GetPipelineTypeString(PSODesc->PipelineType);
    lVar1._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
    lVar1._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
    lVar1._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
    lVar1._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
    lVar1._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
    lVar1._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
    lVar1._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
    lVar1._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
    if (lVar1 == 0) {
      local_c0 = "";
    }
    else {
      local_c0 = *(char **)&GraphicsPipeline_local->BlendDesc;
    }
    pcStack_58 = local_c0;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[36]>
              (false,"ValidateGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x53,(char (*) [16])"Description of ",&local_50,(char (*) [7])0xc0e54c,
               &stack0xffffffffffffffa8,(char (*) [15])"\' is invalid: ",
               (char (*) [36])"NumViewports must be greater than 0");
  }
  if ((char)SRProps_local[2].MaxTileSize[1] != '\0') {
    SVar8 = Diligent::operator&(local_48->CapFlags,SHADING_RATE_CAP_FLAG_SAMPLE_MASK);
    if ((SVar8 == SHADING_RATE_CAP_FLAG_NONE) &&
       (local_5c = (1 << (SRProps_local[3].ShadingRates[6].SampleBits &
                         (SAMPLE_COUNT_16|SAMPLE_COUNT_8|SAMPLE_COUNT_4|SAMPLE_COUNT_2|
                         SAMPLE_COUNT_1))) - 1,
       (SRProps_local[1].MinTileSize[0] & local_5c) != local_5c)) {
      local_68 = GetPipelineTypeString
                           ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
      lVar2._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
      lVar2._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
      lVar2._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
      lVar2._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
      lVar2._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
      lVar2._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
      lVar2._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
      lVar2._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
      if (lVar2 == 0) {
        local_c8 = "";
      }
      else {
        local_c8 = *(char **)&GraphicsPipeline_local->BlendDesc;
      }
      local_70 = local_c8;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[117]>
                (false,"ValidateGraphicsPipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x5c,(char (*) [16])"Description of ",&local_68,(char (*) [7])0xc0e54c,&local_70,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [117])
                 "SampleMask with zero bits is used with ShadingRateFlags, which requires SHADING_RATE_CAP_FLAG_SAMPLE_MASK capability"
                );
    }
    PVar7 = Diligent::operator&((PIPELINE_SHADING_RATE_FLAGS)SRProps_local[2].MaxTileSize[1],
                                PIPELINE_SHADING_RATE_FLAG_PER_PRIMITIVE);
    if (((PVar7 != PIPELINE_SHADING_RATE_FLAG_NONE) &&
        (1 < *(byte *)((long)SRProps_local[2].MaxTileSize + 1))) &&
       (SVar8 = Diligent::operator&(local_48->CapFlags,
                                    SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS),
       SVar8 == SHADING_RATE_CAP_FLAG_NONE)) {
      local_78 = GetPipelineTypeString
                           ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
      lVar3._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
      lVar3._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
      lVar3._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
      lVar3._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
      lVar3._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
      lVar3._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
      lVar3._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
      lVar3._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
      if (lVar3 == 0) {
        local_d0 = (InputLayoutDesc *)0xc361e0;
      }
      else {
        local_d0 = *(InputLayoutDesc **)&GraphicsPipeline_local->BlendDesc;
      }
      InputLayout = local_d0;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[125]>
                (false,"ValidateGraphicsPipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,99,(char (*) [16])"Description of ",&local_78,(char (*) [7])0xc0e54c,
                 (char **)&InputLayout,(char (*) [15])"\' is invalid: ",
                 (char (*) [125])
                 "Multiple viewports with variable shading rate require SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS capability"
                );
    }
  }
  local_88 = &SRProps_local[2].ShadingRateTextureAccess;
  if ((SRProps_local[2].MinTileSize[0] != 0) &&
     (lVar4._0_1_ = SRProps_local[2].ShadingRateTextureAccess,
     lVar4._1_3_ = *(undefined3 *)&SRProps_local[2].field_0x19,
     lVar4._4_4_ = SRProps_local[2].BindFlags, lVar4 == 0)) {
    local_90 = GetPipelineTypeString
                         ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
    lVar5._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
    lVar5._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
    lVar5._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
    lVar5._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
    lVar5._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
    lVar5._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
    lVar5._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
    lVar5._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
    if (lVar5 == 0) {
      local_d8 = "";
    }
    else {
      local_d8 = *(char **)&GraphicsPipeline_local->BlendDesc;
    }
    pcStack_98 = local_d8;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[75],unsigned_int,char[15]>
              (false,"ValidateGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x69,(char (*) [16])"Description of ",&local_90,(char (*) [7])0xc0e54c,
               &stack0xffffffffffffff68,(char (*) [15])"\' is invalid: ",
               (char (*) [75])
               "InputLayout.LayoutElements must not be null when InputLayout.NumElements (",
               (uint *)(local_88 + 8),(char (*) [15])") is not zero.");
  }
  for (Elem._4_4_ = 0; Elem._4_4_ < SRProps_local[2].MinTileSize[0]; Elem._4_4_ = Elem._4_4_ + 1) {
    local_a8 = *(long *)&SRProps_local[2].ShadingRateTextureAccess + (ulong)Elem._4_4_ * 0x28;
    if (0x1f < *(uint *)(local_a8 + 0xc)) {
      local_b0 = GetPipelineTypeString
                           ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
      lVar6._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
      lVar6._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
      lVar6._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
      lVar6._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
      lVar6._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
      lVar6._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
      lVar6._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
      lVar6._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
      if (lVar6 == 0) {
        local_e0 = "";
      }
      else {
        local_e0 = *(char **)&GraphicsPipeline_local->BlendDesc;
      }
      local_b8 = local_e0;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],unsigned_int,char[15],unsigned_int,char[22],unsigned_int,char[3]>
                (false,"ValidateGraphicsPipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x6f,(char (*) [16])"Description of ",&local_b0,(char (*) [7])0xc0e54c,&local_b8,
                 (char (*) [15])"\' is invalid: ",(char (*) [28])"InputLayout.LayoutElements[",
                 (uint *)((long)&Elem + 4),(char (*) [15])"].BufferSlot (",(uint *)(local_a8 + 0xc),
                 (char (*) [22])") exceeds the limit (",&MAX_BUFFER_SLOTS,(char (*) [3])0xccce78);
    }
  }
  return;
}

Assistant:

void ValidateGraphicsPipelineDesc(const PipelineStateDesc& PSODesc, const GraphicsPipelineDesc& GraphicsPipeline, const ShadingRateProperties& SRProps) noexcept(false)
{
    if (GraphicsPipeline.NumViewports == 0)
        LOG_PSO_ERROR_AND_THROW("NumViewports must be greater than 0");

    if (GraphicsPipeline.ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE)
    {
        if ((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SAMPLE_MASK) == 0)
        {
            const Uint32 RequiredMask = (1u << GraphicsPipeline.SmplDesc.Count) - 1;

            if ((GraphicsPipeline.SampleMask & RequiredMask) != RequiredMask)
                LOG_PSO_ERROR_AND_THROW("SampleMask with zero bits is used with ShadingRateFlags, which requires SHADING_RATE_CAP_FLAG_SAMPLE_MASK capability");
        }

        if ((GraphicsPipeline.ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_PER_PRIMITIVE) != 0 &&
            GraphicsPipeline.NumViewports > 1 &&
            (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS) == 0)
        {
            LOG_PSO_ERROR_AND_THROW("Multiple viewports with variable shading rate require SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS capability");
        }
    }

    const InputLayoutDesc& InputLayout = GraphicsPipeline.InputLayout;
    if (InputLayout.NumElements > 0 && GraphicsPipeline.InputLayout.LayoutElements == nullptr)
        LOG_PSO_ERROR_AND_THROW("InputLayout.LayoutElements must not be null when InputLayout.NumElements (", InputLayout.NumElements, ") is not zero.");

    for (Uint32 i = 0; i < GraphicsPipeline.InputLayout.NumElements; ++i)
    {
        const LayoutElement& Elem = GraphicsPipeline.InputLayout.LayoutElements[i];
        if (Elem.BufferSlot >= MAX_BUFFER_SLOTS)
            LOG_PSO_ERROR_AND_THROW("InputLayout.LayoutElements[", i, "].BufferSlot (", Elem.BufferSlot, ") exceeds the limit (", MAX_BUFFER_SLOTS, ").");
    }
}